

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void anon_unknown.dwarf_8b1c::do_encode_decode_float_test(float expected)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer *__ptr;
  AssertionResult *this;
  char *message;
  char *in_R9;
  key_encoder local_180;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  float local_44;
  F actual;
  Message local_38;
  AssertionResult gtest_ar_;
  AssertHelper AStack_20;
  float expected_local;
  
  local_180.buf = local_180.ibuf;
  local_180.cap = 0x100;
  local_180.off = 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = expected;
  unodb::key_encoder::encode((key_encoder *)local_180.buf,expected);
  uVar1 = *(uint *)local_180.buf;
  uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8;
  uVar3 = uVar2 | uVar1 << 0x18;
  if (uVar3 + 2 < 3) {
    local_44 = *(float *)(&DAT_00153150 + (ulong)(uVar3 + 2) * 4);
  }
  else {
    local_44 = (float)~uVar3;
    if ((int)uVar3 < 0) {
      local_44 = (float)(uVar2 | uVar1 << 0x18 & 0x7fffffff);
    }
  }
  if (NAN(gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_)) {
    local_38.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = (internal)NAN(local_44);
    this = &gtest_ar_;
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (!(bool)local_38.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl._0_1_) {
      testing::Message::Message((Message *)&stack0xffffffffffffffe0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_68,(internal *)&local_38,(AssertionResult *)"std::isnan(actual)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffffc0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x18e,(char *)CONCAT71(local_68._1_7_,local_68[0]));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffffc0,(Message *)&stack0xffffffffffffffe0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffc0);
      if ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)CONCAT71(local_68._1_7_,local_68[0]) != &gtest_ar.message_) {
        operator_delete((undefined1 *)CONCAT71(local_68._1_7_,local_68[0]),
                        (long)gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 1);
      }
      if (AStack_20.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)AStack_20.data_ + 8))();
      }
    }
    gtest_ar._0_8_ = gtest_ar_._0_8_;
    if (gtest_ar_._0_8_ == 0) goto LAB_00119a74;
  }
  else {
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)local_68,"(actual)","(expected)",&local_44,
               (float *)((long)&gtest_ar_.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4));
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message(&local_38);
      if (gtest_ar._0_8_ == 0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&stack0xffffffffffffffe0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
                 ,0x193,message);
      testing::internal::AssertHelper::operator=(&stack0xffffffffffffffe0,&local_38);
      testing::internal::AssertHelper::~AssertHelper(&stack0xffffffffffffffe0);
      if ((long *)CONCAT71(local_38.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_38.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_38.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_38.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
    }
    if (gtest_ar._0_8_ == 0) goto LAB_00119a74;
    this = &gtest_ar;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     gtest_ar._0_8_);
LAB_00119a74:
  if (0x100 < local_180.cap) {
    free(local_180.buf);
  }
  return;
}

Assistant:

void do_encode_decode_float_test(const float expected) {
  using U = std::uint32_t;
  using F = float;
  // encode
  unodb::key_encoder enc;
  enc.reset().encode(expected);
  // Check decode as float (round trip).
  F actual;
  {
    unodb::key_decoder dec{enc.get_key_view()};
    dec.decode(actual);
  }
  if (std::isnan(expected)) {
    // Verify canonical NaN.
    UNODB_EXPECT_TRUE(std::isnan(actual));
    U u;
    unodb::key_decoder dec{enc.get_key_view()};
    dec.decode(u);
  } else {
    UNODB_EXPECT_EQ(actual, expected);
  }
}